

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.c
# Opt level: O0

void replay_commandloop(int fd)

{
  char cVar1;
  wchar_t wVar2;
  size_t sVar3;
  nh_cmd_desc *local_280;
  nh_cmd_desc *cmd;
  nh_cmd_arg noarg;
  nh_replay_info rinfo;
  nh_bool firsttime;
  nh_bool ret;
  char qbuf [256];
  char buf [256];
  int count;
  int move;
  int key;
  int fd_local;
  
  rinfo.moves._2_1_ = '\x01';
  create_game_windows();
  reset_old_status();
  cVar1 = nh_view_replay_start(fd,&curses_replay_windowprocs,&noarg);
  if (cVar1 != '\0') {
    load_keymap();
LAB_0011c833:
    draw_msgwin();
    curses_update_status((nh_player_info *)0x0);
    draw_sidebar();
    draw_replay_info((nh_replay_info *)&noarg);
    if (rinfo.moves._2_1_ != '\0') {
      show_replay_help();
    }
    rinfo.moves._2_1_ = '\0';
    update_old_status();
    wVar2 = get_map_key(L'\x01');
    if (wVar2 == L'\x1b') goto LAB_0011ca9d;
    if (wVar2 != L' ') {
      if (wVar2 == L'g') {
        strncpy((char *)&rinfo.max_moves,"What move do you want to jump to?",0x100);
        if (0 < rinfo.max_actions) {
          sVar3 = strlen((char *)&rinfo.max_moves);
          sprintf(rinfo.nextcmd + sVar3 + 0x4c," (Max: %d)",(ulong)(uint)rinfo.max_actions);
        }
        curses_getline((char *)&rinfo.max_moves,qbuf + 0xf8);
        if ((qbuf[0xf8] != '\x1b') && (buf._252_4_ = atoi(qbuf + 0xf8), buf._252_4_ != 0)) {
          nh_view_replay_step(&noarg,2,buf._252_4_);
        }
        goto LAB_0011c833;
      }
      if (wVar2 == L'Ą') {
        nh_view_replay_step(&noarg,1);
        draw_replay_info((nh_replay_info *)&noarg);
        goto LAB_0011c833;
      }
      if (wVar2 != L'ą') {
        if (wVar2 == L'Ĕ') {
          timetest(fd,(nh_replay_info *)&noarg);
        }
        else {
          buf[0xf8] = '\0';
          buf[0xf9] = '\0';
          buf[0xfa] = '\0';
          buf[0xfb] = '\0';
          cmd._4_4_ = 2;
          local_280 = keymap[wVar2];
          if (local_280 != (nh_cmd_desc *)0x0) {
            if ((local_280->flags & 0x80000000) != 0) {
              handle_internal_cmd(&local_280,(nh_cmd_arg *)((long)&cmd + 4),(int *)(buf + 0xf8));
            }
            if (local_280 != (nh_cmd_desc *)0x0) {
              nh_command(local_280,buf._248_4_,(long)&cmd + 4);
            }
          }
        }
        goto LAB_0011c833;
      }
    }
    rinfo.moves._3_1_ = nh_view_replay_step(&noarg,0,1);
    draw_replay_info((nh_replay_info *)&noarg);
    if ((rinfo.moves._3_1_ != '\0') ||
       (wVar2 = curses_msgwin("You have reached the end of this game. Go back or press ESC to exit."
                             ), wVar2 != L'\x1b')) goto LAB_0011c833;
LAB_0011ca9d:
    nh_view_replay_finish();
    free_keymap();
    destroy_game_windows();
    cleanup_messages();
  }
  return;
}

Assistant:

void replay_commandloop(int fd)
{
    int key, move, count;
    char buf[BUFSZ], qbuf[BUFSZ];
    nh_bool ret, firsttime = TRUE;
    struct nh_replay_info rinfo;
    struct nh_cmd_arg noarg;
    struct nh_cmd_desc *cmd;
    
    create_game_windows();
    reset_old_status();
    if (!nh_view_replay_start(fd, &curses_replay_windowprocs, &rinfo))
	return;
    load_keymap();
    
    while (1) {
	draw_msgwin();
	curses_update_status(NULL);
	draw_sidebar();
	draw_replay_info(&rinfo);
	if (firsttime)
	    show_replay_help();
	firsttime = FALSE;
	update_old_status();

	key = get_map_key(TRUE);
	switch (key) {
	    /* step forward */
	    case KEY_RIGHT:
	    case ' ':
		ret = nh_view_replay_step(&rinfo, REPLAY_FORWARD, 1);
		draw_replay_info(&rinfo);
		if (ret == FALSE) {
		    key = curses_msgwin("You have reached the end of this game. "
		                        "Go back or press ESC to exit.");
		    if (key == KEY_ESC)
			goto out;
		}
		break;
		
	    /* step backward */
	    case KEY_LEFT:
		nh_view_replay_step(&rinfo, REPLAY_BACKWARD, 1);
		draw_replay_info(&rinfo);
		break;
		
	    case KEY_ESC:
		goto out;

	    case 'g':
		strncpy(qbuf, "What move do you want to jump to?", BUFSZ);
		if (rinfo.max_moves > 0)
		    sprintf(qbuf + strlen(qbuf), " (Max: %d)", rinfo.max_moves);
		
		curses_getline(qbuf, buf);
		if (buf[0] == '\033' || !(move = atoi(buf)))
		    break;
		nh_view_replay_step(&rinfo, REPLAY_GOTO, move);
		break;

	    case KEY_F(12): /* timetest! */
		if (allow_timetest())
		    timetest(fd, &rinfo);
		break;
		
	    default:
		count = 0;
		noarg.argtype = CMD_ARG_NONE;
		cmd = keymap[key];
		if (!cmd)
		    break;
		if (cmd->flags & CMD_UI)
		    handle_internal_cmd(&cmd, &noarg, &count);
		if (cmd)
		    nh_command(cmd->name, count, &noarg);
		break;
	}
    }
    
out:
    nh_view_replay_finish();
    free_keymap();
    destroy_game_windows();
    cleanup_messages();
}